

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_outputParametersOfType_Test::~TEST_MockSupport_c_outputParametersOfType_Test
          (TEST_MockSupport_c_outputParametersOfType_Test *this)

{
  TEST_MockSupport_c_outputParametersOfType_Test *this_local;
  
  ~TEST_MockSupport_c_outputParametersOfType_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockSupport_c, outputParametersOfType)
{
    int param = 1;
    const int retval = 2;
    mock_c()->installCopier("typeName", typeCopy);
    mock_c()->expectOneCall("foo")->withOutputParameterOfTypeReturning("typeName", "out", &retval);
    mock_c()->actualCall("foo")->withOutputParameterOfType("typeName", "out", &param);
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
    mock_c()->checkExpectations();
    mock_c()->removeAllComparatorsAndCopiers();
}